

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_ReadObjectRec(BCReaderState *s)

{
  ushort uVar1;
  uint uVar2;
  ushort *puVar3;
  JSRuntime *pJVar4;
  list_head *plVar5;
  JSAtomStruct *pJVar6;
  JSValue JVar7;
  JSValue JVar8;
  JSValue JVar9;
  JSValue JVar10;
  int iVar11;
  JSRefCountHeader *p;
  JSValueUnion JVar13;
  ulong uVar14;
  JSValueUnion JVar15;
  int iVar12;
  JSReqModuleEntry *pJVar16;
  JSExportEntry *pJVar17;
  JSArrayBuffer *pJVar18;
  double dVar19;
  JSStarExportEntry *pJVar20;
  JSImportEntry *pJVar21;
  uint8_t *puVar22;
  long lVar23;
  ulong uVar24;
  uintptr_t sp;
  JSValueUnion *pJVar25;
  size_t size;
  JSContext *pJVar26;
  JSValueUnion JVar27;
  int *piVar28;
  uint32_t uVar29;
  uint uVar30;
  uint32_t *puVar31;
  JSAtom *patom;
  long lVar32;
  long lVar33;
  int64_t iVar34;
  byte bVar35;
  JSValue v;
  JSValue v_00;
  JSValue this_obj;
  JSValue v_01;
  JSValue v_02;
  JSValue JVar36;
  JSValue JVar37;
  JSValue v_03;
  JSValue v_04;
  JSValue val;
  JSValueUnion JStackY_130;
  JSValueUnion JStack_108;
  JSAtom module_name;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint16_t local_c8 [12];
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  long local_80;
  uint local_74;
  uint uStack_70;
  int local_count;
  byte local_61;
  JSValueUnion JStack_60;
  uint8_t tag;
  JSValueUnion local_58;
  uint local_4c;
  uint32_t uStack_48;
  uint32_t offset;
  JSValueUnion local_40;
  byte local_31 [8];
  uint8_t v8;
  
  bVar35 = 0;
  pJVar26 = s->ctx;
  JStack_60 = (JSValueUnion)0x0;
  if (&stack0xfffffffffffffff8 < (undefined1 *)pJVar26->rt->stack_limit) {
    JS_ThrowStackOverflow(pJVar26);
    goto LAB_00126737;
  }
  iVar11 = bc_get_u8(s,&local_61);
  if (iVar11 != 0) goto LAB_00126737;
  switch(local_61) {
  case 1:
    JStack_60.ptr = (void *)((ulong)(uint)JStack_60._4_4_ << 0x20);
    JStackY_130 = (JSValueUnion)0x2;
    goto LAB_00126d75;
  case 2:
    JStack_60.ptr = (void *)((ulong)(uint)JStack_60._4_4_ << 0x20);
    JStackY_130 = (JSValueUnion)0x3;
    goto LAB_00126d75;
  case 3:
  case 4:
    JStack_60._1_7_ = 0;
    JStack_60.int32._0_1_ = local_61 != 3;
    JStackY_130 = (JSValueUnion)0x1;
    goto LAB_00126d75;
  case 5:
    uVar30 = get_sleb128(&JStack_108.int32,s->ptr,s->buf_end);
    if (-1 < (int)uVar30) {
      s->ptr = s->ptr + uVar30;
      JVar10.tag = 0;
      JVar10.u.ptr = (void *)((ulong)JStack_108.ptr & 0xffffffff);
      return JVar10;
    }
    bc_read_error_end(s);
    goto LAB_00126737;
  case 6:
    iVar11 = bc_get_u64(s,(uint64_t *)&JStack_108.int32);
    if (iVar11 != 0) goto LAB_00126737;
    JStack_60 = JStack_108;
    JStackY_130 = (JSValueUnion)0x7;
    goto LAB_00126d75;
  case 7:
    JStack_60.ptr = JS_ReadString(s);
    if ((JSContext *)JStack_60.ptr == (JSContext *)0x0) goto LAB_00126737;
    JStackY_130 = (JSValueUnion)0xfffffffffffffff9;
LAB_00126d75:
    JVar7.tag = (int64_t)JStackY_130;
    JVar7.u.ptr = JStack_60.ptr;
    break;
  case 8:
    local_40 = (JSValueUnion)s->ctx;
    JVar36 = JS_NewObject((JSContext *)local_40.ptr);
    this_obj.tag = JVar36.tag;
    JVar15 = JVar36.u;
    iVar11 = BC_add_object_ref1(s,(JSObject *)JVar15.ptr);
    if ((iVar11 == 0) &&
       (iVar11 = bc_get_leb128(s,(uint32_t *)&JStack_108.int32), JVar13 = local_40, iVar11 == 0)) {
      iVar11 = JStack_108.int32 + 1;
      local_58 = JVar15;
      do {
        JVar15 = local_58;
        JVar9.tag = this_obj.tag;
        JVar9.u.ptr = local_58.ptr;
        iVar11 = iVar11 + -1;
        if (iVar11 == 0) {
          return JVar9;
        }
        iVar12 = bc_get_atom(s,&local_4c);
        if (iVar12 != 0) break;
        JVar36 = JS_ReadObjectRec(s);
        if ((int)JVar36.tag == 6) {
          JS_FreeAtom((JSContext *)local_40.ptr,local_4c);
          break;
        }
        _uStack_48 = (JSContext *)CONCAT44(offset,local_4c);
        this_obj.u.ptr = JVar15.ptr;
        iVar12 = JS_DefinePropertyValue((JSContext *)JVar13.ptr,this_obj,local_4c,JVar36,7);
        JS_FreeAtom((JSContext *)JVar13.ptr,uStack_48);
        JVar15 = local_58;
      } while (-1 < iVar12);
    }
    JVar37.tag = this_obj.tag;
    JVar37.u.ptr = JVar15.ptr;
    JVar15 = local_40;
    goto LAB_00127598;
  case 9:
  case 0xd:
    local_40 = (JSValueUnion)s->ctx;
    JVar36 = JS_NewArray((JSContext *)local_40.ptr);
    iVar11 = BC_add_object_ref1(s,(JSObject *)JVar36.u.ptr);
    if ((iVar11 == 0) && (iVar11 = bc_get_leb128(s,(uint32_t *)&JStack_108.int32), iVar11 == 0)) {
      _uStack_48 = (JSContext *)CONCAT44(offset,JStack_108.int32);
      local_58.int32 = (uint)(local_61 != 0xd) * 3 + 4;
      uVar29 = 0;
      do {
        if (uStack_48 == uVar29) {
          if (local_61 != 0xd) {
            return JVar36;
          }
          JVar37 = JS_ReadObjectRec(s);
          if (((int)JVar37.tag == 3) ||
             (((int)JVar37.tag != 6 &&
              (iVar11 = JS_DefinePropertyValue((JSContext *)local_40,JVar36,0x70,JVar37,0),
              -1 < iVar11)))) {
            JS_PreventExtensions((JSContext *)local_40,JVar36);
            return JVar36;
          }
          break;
        }
        JVar37 = JS_ReadObjectRec(s);
        if ((int)JVar37.tag == 6) break;
        iVar11 = JS_DefinePropertyValueUint32
                           ((JSContext *)local_40,JVar36,uVar29,JVar37,local_58._0_4_);
        uVar29 = uVar29 + 1;
      } while (-1 < iVar11);
    }
    JS_FreeValue((JSContext *)local_40,JVar36);
    JVar7 = (JSValue)(ZEXT816(6) << 0x40);
    break;
  default:
    goto switchD_00126772_caseD_a;
  case 0xe:
    if ((*(uint *)&s->field_0x34 & 0xff00) == 0) goto switchD_00126772_caseD_a;
    JVar15 = (JSValueUnion)s->ctx;
    _module_name = (uint8_t *)0x0;
    local_f8 = 0.0;
    uStack_f0 = 0;
    local_e8 = 0.0;
    uStack_e0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_c8[0] = 0;
    local_c8[1] = 0;
    local_c8[2] = 0;
    local_c8[3] = 0;
    local_c8[4] = 0;
    local_c8[5] = 0;
    local_c8[6] = 0;
    local_c8[7] = 0;
    local_c8[8] = 0;
    local_c8[9] = 0;
    local_c8[10] = 0;
    local_c8[0xb] = 0;
    uStack_b0 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    JStack_108.float64 = 4.94065645841247e-324;
    puVar3 = (ushort *)s->ptr;
    if ((long)s->buf_end - (long)puVar3 < 2) {
      bc_read_error_end(s);
LAB_0012758c:
      iVar34 = 3;
      JVar13.float64 = 0.0;
LAB_0012758f:
      JVar37.tag = iVar34;
      JVar37.u.ptr = JVar13.ptr;
      goto LAB_00127598;
    }
    uVar1 = *puVar3;
    s->ptr = (uint8_t *)(puVar3 + 1);
    uStack_f0 = (ulong)((ushort)(*(uint *)&s->field_0x34 >> 4) & 0x1000 | uVar1 & 0xfff) << 8;
    iVar11 = bc_get_u8(s,local_31);
    if (iVar11 != 0) goto LAB_0012758c;
    uStack_f0 = CONCAT71(uStack_f0._1_7_,local_31[0]);
    iVar11 = bc_get_atom(s,(JSAtom *)((long)&uStack_e0 + 4));
    if ((((((iVar11 != 0) || (iVar11 = bc_get_leb128_u16(s,local_c8), iVar11 != 0)) ||
          (iVar11 = bc_get_leb128_u16(s,local_c8 + 1), iVar11 != 0)) ||
         ((iVar11 = bc_get_leb128_u16(s,local_c8 + 2), iVar11 != 0 ||
          (iVar11 = bc_get_leb128_u16(s,local_c8 + 3), iVar11 != 0)))) ||
        ((iVar11 = bc_get_leb128(s,(uint32_t *)((long)&uStack_b0 + 4)), iVar11 != 0 ||
         ((iVar11 = bc_get_leb128(s,(uint32_t *)&uStack_b0), iVar11 != 0 ||
          (iVar11 = bc_get_leb128(s,(uint32_t *)&uStack_e0), iVar11 != 0)))))) ||
       (iVar11 = bc_get_leb128(s,&local_74), iVar11 != 0)) goto LAB_0012758c;
    lVar32 = (ulong)(uStack_f0._1_2_ >> 5 & 0x20) + 0x60;
    _uStack_48 = (JSContext *)(uStack_b0 & 0xffffffff);
    local_58._4_4_ = 0;
    local_58.int32 = local_74;
    local_40.ptr = (void *)(lVar32 << 0x20);
    lVar33 = (long)(((ulong)(local_74 + (uint32_t)uStack_b0) << 0x24) + (long)local_40.ptr) >> 0x20;
    local_80 = (long)uStack_b0._4_4_ * 8 + lVar33;
    uVar29 = 0;
    if ((uStack_f0._1_2_ >> 0xc & 1) == 0) {
      uVar29 = (uint32_t)uStack_e0;
    }
    JVar13.ptr = js_mallocz((JSContext *)JVar15.ptr,(long)(int)(uVar29 + (int)local_80));
    if ((undefined8 *)JVar13.ptr != (undefined8 *)0x0) {
      pJVar25 = &JStack_108;
      JVar27.ptr = JVar13.ptr;
      for (lVar23 = 0xc; lVar23 != 0; lVar23 = lVar23 + -1) {
        *(JSValueUnion *)JVar27.ptr = *pJVar25;
        pJVar25 = pJVar25 + (ulong)bVar35 * -2 + 1;
        JVar27.float64 = JVar27.float64 + (ulong)bVar35 * -0x10 + 8;
      }
      *(undefined4 *)JVar13.ptr = 1;
      if (local_58._0_4_ != 0) {
        *(long *)((long)JVar13.ptr + 0x30) =
             ((long)local_40.ptr + ((long)_uStack_48 << 0x24) >> 0x20) + (long)JVar13.ptr;
      }
      iVar11 = *(int *)((long)JVar13.ptr + 0x5c);
      if (iVar11 != 0) {
        *(long *)((long)JVar13.ptr + 0x38) = lVar33 + (long)JVar13.ptr;
      }
      if (*(int *)((long)JVar13.ptr + 0x58) != 0) {
        *(long *)((long)JVar13.ptr + 0x50) = lVar32 + (long)JVar13.ptr;
      }
      pJVar4 = *(JSRuntime **)((long)JVar15.ptr + 0x18);
      *(undefined1 *)((long)JVar13.ptr + 4) = 1;
      plVar5 = (pJVar4->gc_obj_list).prev;
      plVar5->next = (list_head *)((long)JVar13.ptr + 8);
      *(list_head **)((long)JVar13.ptr + 8) = plVar5;
      *(list_head **)((long)JVar13.ptr + 0x10) = &pJVar4->gc_obj_list;
      (pJVar4->gc_obj_list).prev = (list_head *)((long)JVar13.ptr + 8);
      iVar34 = -2;
      if (local_58._0_4_ != 0) {
        local_40.float64 = 0.0;
        uVar14 = (ulong)local_58.ptr & 0xffffffff;
        if ((int)local_58._0_4_ < 1) {
          uVar14 = 0;
        }
        local_58.ptr = (void *)(uVar14 << 4);
        for (; local_58.ptr != local_40.ptr; local_40.float64 = local_40.float64 + 0x10) {
          _uStack_48 = *(JSContext **)((long)JVar13.ptr + 0x30);
          iVar11 = bc_get_atom(s,(JSAtom *)((long)_uStack_48 + (long)local_40.ptr));
          if ((iVar11 != 0) ||
             (iVar11 = bc_get_leb128(s,(uint32_t *)
                                       ((uint8_t *)((long)_uStack_48 + (long)local_40.ptr) + 4)),
             iVar11 != 0)) goto LAB_0012758f;
          puVar31 = (uint32_t *)((uint8_t *)((long)_uStack_48 + (long)local_40.ptr) + 8);
          iVar11 = bc_get_leb128(s,puVar31);
          if (iVar11 != 0) goto LAB_0012758f;
          *puVar31 = *puVar31 - 1;
          iVar11 = bc_get_u8(s,local_31);
          if (iVar11 != 0) goto LAB_0012758f;
          *(uint *)((uint8_t *)((long)_uStack_48 + 0xc) + (long)local_40.ptr) =
               local_31[0] >> 4 & 7 |
               (*(uint *)((uint8_t *)((long)_uStack_48 + 0xc) + (long)local_40.ptr) & 0xffffff80) +
               (local_31[0] & 0xf) * 8;
        }
        iVar11 = *(int *)((long)JVar13.ptr + 0x5c);
      }
      if (iVar11 != 0) {
        _uStack_48 = (JSContext *)0x4;
        for (local_40.float64 = 0.0; (long)local_40.ptr < (long)iVar11;
            local_40.float64 = local_40.float64 + 1) {
          lVar33 = *(long *)((long)JVar13.ptr + 0x38);
          iVar11 = bc_get_atom(s,(JSAtom *)((long)_uStack_48 + lVar33));
          if ((iVar11 != 0) || (iVar11 = bc_get_leb128(s,&local_4c), iVar11 != 0))
          goto LAB_0012758f;
          *(undefined2 *)(lVar33 + 2 + (long)local_40.ptr * 8) = (undefined2)local_4c;
          iVar11 = bc_get_u8(s,local_31);
          if (iVar11 != 0) goto LAB_0012758f;
          *(byte *)(lVar33 + (long)local_40.ptr * 8) = local_31[0];
          iVar11 = *(int *)((long)JVar13.ptr + 0x5c);
          _uStack_48 = (JSContext *)((long)_uStack_48 + 8);
        }
      }
      _uStack_70 = (int *)(ulong)*(uint *)((long)JVar13.ptr + 0x28);
      if (s->field_0x36 == '\0') {
        _uStack_48 = (JSContext *)((long)(int)local_80 + (long)JVar13.ptr);
        iVar11 = bc_get_buf(s,(uint8_t *)_uStack_48,*(uint *)((long)JVar13.ptr + 0x28));
        if (iVar11 == 0) goto LAB_001276cb;
      }
      else {
        _uStack_48 = (JSContext *)s->ptr;
        if ((long)s->buf_end - (long)_uStack_48 < (long)_uStack_70) {
          bc_read_error_end(s);
        }
        else {
          s->ptr = (uint8_t *)((long)_uStack_70 + (long)_uStack_48);
LAB_001276cb:
          *(JSContext **)((long)JVar13.ptr + 0x20) = _uStack_48;
          for (uVar30 = 0; JVar27 = local_40, uVar30 < uStack_70; uVar30 = uVar30 + local_40._0_4_)
          {
            local_58._4_4_ = 0;
            local_58.int32 = uVar30;
            bVar35 = *(byte *)((long)_uStack_48 + (long)local_58.ptr);
            uVar2 = bVar35 + 0xf;
            if (bVar35 < 0xb2) {
              uVar2 = (uint)bVar35;
            }
            local_40.int32._1_3_ = 0;
            local_40.int32._0_1_ = opcode_info[uVar2].size;
            local_40._4_4_ = JVar27._4_4_;
            if ((byte)(opcode_info[uVar2].fmt - 0x17) < 5) {
              uVar2 = *(uint *)((uint8_t *)((long)_uStack_48 + 1) + (long)local_58.ptr);
              if (s->field_0x36 == '\0') {
                iVar11 = bc_idx_to_atom(s,&local_4c,uVar2);
                if (iVar11 != 0) {
                  *(uint *)((long)JVar13.ptr + 0x28) = uVar30;
                  goto LAB_0012758f;
                }
                *(uint *)((uint8_t *)((long)_uStack_48 + 1) + (long)local_58.ptr) = local_4c;
              }
              else if (0xd1 < (int)uVar2) {
                pJVar6 = s->ctx->rt->atom_array[uVar2];
                (pJVar6->header).ref_count = (pJVar6->header).ref_count + 1;
              }
            }
          }
          if ((*(byte *)((long)JVar13.ptr + 0x1a) & 4) == 0) goto LAB_00127774;
          iVar11 = bc_get_atom(s,(JSAtom *)((long)JVar13.ptr + 0x60));
          if ((iVar11 == 0) &&
             (iVar11 = bc_get_leb128(s,(uint32_t *)((long)JVar13.ptr + 100)), iVar11 == 0)) {
            iVar11 = bc_get_leb128(s,(uint32_t *)((long)JVar13.ptr + 0x6c));
            if (iVar11 == 0) {
              size = (size_t)(int)*(uint32_t *)((long)JVar13.ptr + 0x6c);
              if (size == 0) {
LAB_00127774:
                iVar11 = *(int *)((long)JVar13.ptr + 0x58);
                if (iVar11 != 0) {
                  lVar33 = 8;
                  for (local_40.float64 = 0.0; (long)local_40.ptr < (long)iVar11;
                      local_40.float64 = local_40.float64 + 1) {
                    JVar36 = JS_ReadObjectRec(s);
                    if ((int)JVar36.tag == 6) goto LAB_0012758f;
                    lVar32 = *(long *)((long)JVar13.ptr + 0x50);
                    *(JSValueUnion *)(lVar32 + -8 + lVar33) = JVar36.u;
                    *(int64_t *)(lVar32 + lVar33) = JVar36.tag;
                    iVar11 = *(int *)((long)JVar13.ptr + 0x58);
                    lVar33 = lVar33 + 0x10;
                  }
                }
                *(int *)JVar15.ptr = *JVar15.ptr + 1;
                ((JSValueUnion *)((long)JVar13.ptr + 0x48))->ptr = (void *)JVar15;
                JVar8.tag = -2;
                JVar8.u.ptr = JVar13.ptr;
                return JVar8;
              }
              puVar22 = (uint8_t *)js_mallocz((JSContext *)JVar15.ptr,size);
              *(uint8_t **)((long)JVar13.ptr + 0x70) = puVar22;
              if ((puVar22 != (uint8_t *)0x0) &&
                 (iVar11 = bc_get_buf(s,puVar22,*(uint32_t *)((long)JVar13.ptr + 0x6c)), iVar11 == 0
                 )) goto LAB_00127774;
            }
          }
        }
      }
      goto LAB_0012758f;
    }
    goto LAB_0012759d;
  case 0xf:
    if (s->field_0x35 != '\0') {
      pJVar26 = s->ctx;
      iVar11 = bc_get_atom(s,(JSAtom *)&JStack_108.int32);
      if (iVar11 == 0) {
        local_40.ptr = js_new_module_def(pJVar26,JStack_108.int32);
        if ((JSModuleDef *)local_40.ptr != (JSModuleDef *)0x0) {
          (((JSModuleDef *)local_40.ptr)->header).ref_count =
               (((JSModuleDef *)local_40.ptr)->header).ref_count + 1;
          piVar28 = &((JSModuleDef *)local_40.ptr)->req_module_entries_count;
          _uStack_48 = pJVar26;
          iVar11 = bc_get_leb128(s,(uint32_t *)piVar28);
          JVar15 = local_40;
          if (iVar11 == 0) {
            iVar11 = *piVar28;
            if ((long)iVar11 == 0) {
LAB_0012721d:
              piVar28 = (int *)((long)local_40 + 0x30);
              iVar11 = bc_get_leb128(s,(uint32_t *)piVar28);
              JVar15 = local_40;
              if (iVar11 == 0) {
                iVar11 = *piVar28;
                if ((long)iVar11 == 0) {
LAB_001273fe:
                  piVar28 = (int *)((long)local_40 + 0x40);
                  iVar11 = bc_get_leb128(s,(uint32_t *)piVar28);
                  JVar15 = local_40;
                  if (iVar11 == 0) {
                    iVar11 = *piVar28;
                    if ((long)iVar11 == 0) {
LAB_001274b4:
                      local_58.float64 = local_40.float64 + 0x50;
                      iVar11 = bc_get_leb128(s,(uint32_t *)local_58.ptr);
                      JVar15 = local_40;
                      if (iVar11 == 0) {
                        iVar11 = *local_58.ptr;
                        if ((long)iVar11 == 0) {
LAB_001275b1:
                          JVar36 = JS_ReadObjectRec(s);
                          *(JSValue *)((long)local_40 + 0x68) = JVar36;
                          if ((int)JVar36.tag != 6) {
                            uVar24 = (ulong)local_40 & 0xffffffff00000000;
                            uVar14 = (ulong)local_40 & 0xffffffff;
                            local_40.float64 = -NAN;
                            goto LAB_00126d05;
                          }
                        }
                        else {
                          *(int *)((long)local_40 + 0x54) = iVar11;
                          pJVar21 = (JSImportEntry *)js_mallocz(_uStack_48,(long)iVar11 * 0xc);
                          *(JSImportEntry **)((long)JVar15 + 0x48) = pJVar21;
                          if (pJVar21 != (JSImportEntry *)0x0) {
                            lVar33 = -1;
                            lVar32 = 0;
                            do {
                              lVar33 = lVar33 + 1;
                              if (*local_58.ptr <= lVar33) goto LAB_001275b1;
                              pJVar21 = *(JSImportEntry **)((long)local_40 + 0x48);
                              iVar11 = bc_get_leb128(s,(uint32_t *)
                                                       ((long)&pJVar21->var_idx + lVar32));
                              if ((iVar11 != 0) ||
                                 (iVar11 = bc_get_atom(s,(JSAtom *)
                                                         ((long)&pJVar21->import_name + lVar32)),
                                 iVar11 != 0)) break;
                              puVar31 = (uint32_t *)((long)&pJVar21->req_module_idx + lVar32);
                              lVar32 = lVar32 + 0xc;
                              iVar11 = bc_get_leb128(s,puVar31);
                            } while (iVar11 == 0);
                          }
                        }
                      }
                    }
                    else {
                      *(int *)((long)local_40 + 0x44) = iVar11;
                      pJVar20 = (JSStarExportEntry *)js_mallocz(_uStack_48,(long)iVar11 << 2);
                      *(JSStarExportEntry **)((long)JVar15 + 0x38) = pJVar20;
                      if (pJVar20 != (JSStarExportEntry *)0x0) {
                        lVar33 = -1;
                        lVar32 = 0;
                        do {
                          lVar33 = lVar33 + 1;
                          if (*piVar28 <= lVar33) goto LAB_001274b4;
                          iVar11 = bc_get_leb128(s,(uint32_t *)
                                                   ((long)&(*(JSStarExportEntry **)
                                                             ((long)local_40 + 0x38))->
                                                           req_module_idx + lVar32));
                          lVar32 = lVar32 + 4;
                        } while (iVar11 == 0);
                      }
                    }
                  }
                }
                else {
                  *(int *)((long)local_40 + 0x34) = iVar11;
                  pJVar17 = (JSExportEntry *)js_mallocz(_uStack_48,(long)iVar11 << 5);
                  *(JSExportEntry **)((long)JVar15 + 0x28) = pJVar17;
                  if (pJVar17 != (JSExportEntry *)0x0) {
                    lVar33 = 0x18;
                    local_58.float64 = -NAN;
                    _uStack_70 = piVar28;
                    do {
                      local_58.float64 = local_58.float64 + 1;
                      if ((long)*piVar28 <= (long)local_58.ptr) goto LAB_001273fe;
                      pJVar17 = *(JSExportEntry **)((long)local_40 + 0x28);
                      iVar11 = bc_get_u8(s,(uint8_t *)&local_4c);
                      if (iVar11 != 0) break;
                      uVar30 = local_4c & 0xff;
                      *(uint *)((long)pJVar17 + lVar33 + -8) = uVar30;
                      iVar11 = bc_get_leb128(s,(uint32_t *)((long)pJVar17 + lVar33 + -0x18));
                      piVar28 = _uStack_70;
                      if (uVar30 != 0) {
                        if (iVar11 != 0) break;
                        iVar11 = bc_get_atom(s,(JSAtom *)((long)pJVar17 + lVar33 + -4));
                      }
                      if (iVar11 != 0) break;
                      patom = (JSAtom *)((long)&pJVar17->u + lVar33);
                      lVar33 = lVar33 + 0x20;
                      iVar11 = bc_get_atom(s,patom);
                    } while (iVar11 == 0);
                  }
                }
              }
            }
            else {
              *(int *)((long)local_40 + 0x24) = iVar11;
              pJVar16 = (JSReqModuleEntry *)js_mallocz(_uStack_48,(long)iVar11 << 4);
              *(JSReqModuleEntry **)((long)JVar15 + 0x18) = pJVar16;
              if (pJVar16 != (JSReqModuleEntry *)0x0) {
                lVar33 = -1;
                lVar32 = 0;
                do {
                  lVar33 = lVar33 + 1;
                  if (*piVar28 <= lVar33) goto LAB_0012721d;
                  iVar11 = bc_get_atom(s,(JSAtom *)
                                         ((long)&(*(JSReqModuleEntry **)((long)local_40 + 0x18))->
                                                 module_name + lVar32));
                  lVar32 = lVar32 + 0x10;
                } while (iVar11 == 0);
              }
            }
          }
          js_free_module_def(_uStack_48,(JSModuleDef *)local_40);
        }
      }
      goto LAB_00126d01;
    }
    goto switchD_00126772_caseD_a;
  case 0x10:
    pJVar26 = s->ctx;
    iVar11 = bc_get_u8(s,local_31);
    if (iVar11 == 0) {
      if (local_31[0] < 9) {
        iVar11 = bc_get_leb128(s,&local_74);
        if ((iVar11 == 0) && (iVar11 = bc_get_leb128(s,&local_4c), iVar11 == 0)) {
          local_40 = (JSValueUnion)(ulong)(uint)s->objects_count;
          iVar11 = BC_add_object_ref1(s,(JSObject *)0x0);
          if (iVar11 == 0) {
            JVar36 = JS_ReadObjectRec(s);
            _uStack_48 = (JSContext *)JVar36.tag;
            local_58 = JVar36.u;
            if ((int)JVar36.tag == 6) goto LAB_00126be3;
            pJVar18 = js_get_array_buffer(pJVar26,JVar36);
            if (pJVar18 != (JSArrayBuffer *)0x0) {
              JStack_108.float64 = local_58.float64;
              dVar19 = (double)(long)(int)local_4c;
              local_f8 = (double)local_4c;
              if (-1 < (long)dVar19) {
                local_f8 = dVar19;
              }
              uStack_f0 = 7;
              if (-1 < (long)dVar19) {
                uStack_f0 = 0;
              }
              _module_name = (uint8_t *)_uStack_48;
              uStack_e0 = 7;
              local_e8 = (double)local_74;
              if (-1 < (long)(int)local_74) {
                uStack_e0 = 0;
                local_e8 = (double)(long)(int)local_74;
              }
              v_04 = js_typed_array_constructor
                               (pJVar26,(JSValue)(ZEXT816(3) << 0x40),0,(JSValue *)&JStack_108,
                                local_31[0] + 0x15);
              puVar22 = (uint8_t *)_uStack_48;
              JVar15 = local_58;
              if ((int)v_04.tag != 6) {
                if (0xffffff < *(uint *)&s->field_0x34) {
                  *(JSValueUnion *)(s->objects + (long)local_40) = v_04.u;
                }
                v_02.tag = (int64_t)_uStack_48;
                v_02.u.ptr = local_58.ptr;
                JS_FreeValue(pJVar26,v_02);
                return v_04;
              }
              goto LAB_00126fd1;
            }
            v_04.tag = (int64_t)_uStack_48;
            v_04.u.ptr = local_58.ptr;
          }
          else {
            v_04 = (JSValue)(ZEXT816(3) << 0x40);
            puVar22 = (uint8_t *)0x3;
            JVar15.float64 = 0.0;
LAB_00126fd1:
            v.tag = (int64_t)puVar22;
            v.u.float64 = JVar15.float64;
            JS_FreeValue(pJVar26,v);
          }
          JS_FreeValue(pJVar26,v_04);
        }
      }
      else {
        JS_ThrowTypeError(pJVar26,"invalid typed array");
      }
    }
LAB_00126be3:
    JVar7 = (JSValue)(ZEXT816(6) << 0x40);
    break;
  case 0x11:
    pJVar26 = s->ctx;
    iVar11 = bc_get_leb128(s,(uint32_t *)&JStack_108.int32);
    if (iVar11 == 0) {
      uVar14 = (ulong)JStack_108.ptr & 0xffffffff;
      if ((long)s->buf_end - (long)s->ptr < (long)uVar14) {
        bc_read_error_end(s);
      }
      else {
        JVar36 = JS_NewArrayBufferCopy(pJVar26,s->ptr,uVar14);
        JVar13 = JVar36.u;
        JVar15 = (JSValueUnion)JVar36.tag;
        if (((int)JVar36.tag != 6) &&
           (local_40 = (JSValueUnion)JVar36.tag,
           iVar11 = BC_add_object_ref1(s,(JSObject *)JVar13.ptr), JVar15 = local_40, iVar11 == 0)) {
          s->ptr = s->ptr + uVar14;
          uVar24 = (ulong)JVar13.ptr & 0xffffffff00000000;
          uVar14 = (ulong)JVar13.ptr & 0xffffffff;
          goto LAB_00126d05;
        }
        v_03.tag = (int64_t)JVar15.ptr;
        v_03.u.ptr = JVar13.ptr;
LAB_00126848:
        JS_FreeValue(pJVar26,v_03);
      }
    }
LAB_00126d01:
    uVar14 = 0;
    uVar24 = 0;
    local_40.float64 = 2.96439387504748e-323;
LAB_00126d05:
    JVar15.ptr = (void *)(uVar14 | uVar24);
    JStackY_130 = local_40;
LAB_00126d08:
    JVar7.tag = (int64_t)JStackY_130.ptr;
    JVar7.u.ptr = JVar15.ptr;
    break;
  case 0x12:
    if ((s->field_0x34 != '\0') &&
       ((pJVar26->rt->sab_funcs).sab_dup != (_func_void_void_ptr_void_ptr *)0x0)) {
      pJVar26 = s->ctx;
      iVar11 = bc_get_leb128(s,&local_4c);
      if ((iVar11 != 0) || (iVar11 = bc_get_u64(s,(uint64_t *)&JStack_108.int32), iVar11 != 0))
      goto LAB_00126d01;
      v_03 = js_array_buffer_constructor3
                       (pJVar26,(JSValue)(ZEXT816(3) << 0x40),(ulong)local_4c,0x14,
                        (uint8_t *)JStack_108.ptr,(JSFreeArrayBufferDataFunc *)0x0,(void *)0x0,0);
      JVar15 = v_03.u;
      if (((int)v_03.tag == 6) ||
         (iVar11 = BC_add_object_ref1(s,(JSObject *)JVar15.ptr), iVar11 != 0)) goto LAB_00126848;
      uVar24 = (ulong)JVar15.ptr & 0xffffffff00000000;
      uVar14 = (ulong)JVar15.ptr & 0xffffffff;
      local_40 = (JSValueUnion)v_03.tag;
      goto LAB_00126d05;
    }
switchD_00126772_caseD_a:
    JVar7 = (JSValue)(ZEXT816(6) << 0x40);
    JS_ThrowSyntaxError(pJVar26,"invalid tag (tag=%d pos=%u)",(ulong)local_61,
                        (ulong)(uint)(*(int *)&s->ptr - *(int *)&s->buf_start));
    break;
  case 0x13:
    pJVar26 = s->ctx;
    JVar36 = JS_ReadObjectRec(s);
    v_00.tag = JVar36.tag;
    JVar15 = JVar36.u;
    iVar11 = (int)JVar36.tag;
    if (iVar11 == 6) {
      JVar36 = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
      local_40 = JVar15;
      if ((iVar11 == 0) || (iVar11 == 7)) {
        JVar36 = JS_NewObjectProtoClass(pJVar26,pJVar26->class_proto[10],10);
        JVar15 = local_40;
        if (((int)JVar36.tag != 6) &&
           (iVar11 = BC_add_object_ref1(s,(JSObject *)JVar36.u.ptr), JVar15 = local_40, iVar11 == 0)
           ) {
          val.tag = v_00.tag;
          val.u.ptr = local_40.ptr;
          JS_SetObjectData(pJVar26,JVar36,val);
          return JVar36;
        }
      }
      else {
        JVar36 = (JSValue)(ZEXT816(3) << 0x40);
        JS_ThrowTypeError(pJVar26,"Number tag expected for date");
        JVar15 = local_40;
      }
    }
    v_00.u.ptr = JVar15.ptr;
    JS_FreeValue(pJVar26,v_00);
    JS_FreeValue(pJVar26,JVar36);
    JVar7 = (JSValue)(ZEXT816(6) << 0x40);
    break;
  case 0x14:
    JVar15 = (JSValueUnion)s->ctx;
    JVar36 = JS_ReadObjectRec(s);
    if ((int)JVar36.tag == 6) {
      JVar37 = (JSValue)(ZEXT816(3) << 0x40);
      JVar13 = JVar36.u;
    }
    else {
      local_40 = JVar36.u;
      JVar37 = JS_ToObject((JSContext *)JVar15.ptr,JVar36);
      JVar13 = local_40;
      if (((int)JVar37.tag != 6) &&
         (iVar11 = BC_add_object_ref1(s,(JSObject *)JVar37.u.ptr), JVar13 = local_40, iVar11 == 0))
      {
        v_01.tag = JVar36.tag;
        v_01.u.ptr = local_40.ptr;
        JS_FreeValue((JSContext *)JVar15.ptr,v_01);
        return JVar37;
      }
    }
    JVar36.u.ptr = JVar13.ptr;
    JS_FreeValue((JSContext *)JVar15.ptr,JVar36);
LAB_00127598:
    JS_FreeValue((JSContext *)JVar15.ptr,JVar37);
LAB_0012759d:
    JVar7 = (JSValue)(ZEXT816(6) << 0x40);
    break;
  case 0x15:
    if (0xffffff < *(uint *)&s->field_0x34) {
      iVar11 = bc_get_leb128(s,(uint32_t *)&JStack_108.int32);
      if (iVar11 != 0) goto LAB_00126737;
      if ((uint)s->objects_count <= (uint)JStack_108.int32) {
        JS_ThrowSyntaxError(pJVar26,"invalid object reference (%u >= %u)");
        goto LAB_00126737;
      }
      JStackY_130.float64 = -NAN;
      JVar15 = (JSValueUnion)
               ((JSValueUnion *)(s->objects + ((ulong)JStack_108.ptr & 0xffffffff)))->ptr;
      *(int *)JVar15.ptr = *JVar15.ptr + 1;
      goto LAB_00126d08;
    }
    JS_ThrowSyntaxError(pJVar26,"object references are not allowed");
LAB_00126737:
    JVar7 = (JSValue)(ZEXT816(6) << 0x40);
  }
  return JVar7;
}

Assistant:

static JSValue JS_ReadObjectRec(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    uint8_t tag;
    JSValue obj = JS_UNDEFINED;

    if (js_check_stack_overflow(ctx->rt, 0))
        return JS_ThrowStackOverflow(ctx);

    if (bc_get_u8(s, &tag))
        return JS_EXCEPTION;

    bc_read_trace(s, "%s {\n", bc_tag_str[tag]);

    switch(tag) {
    case BC_TAG_NULL:
        obj = JS_NULL;
        break;
    case BC_TAG_UNDEFINED:
        obj = JS_UNDEFINED;
        break;
    case BC_TAG_BOOL_FALSE:
    case BC_TAG_BOOL_TRUE:
        obj = JS_NewBool(ctx, tag - BC_TAG_BOOL_FALSE);
        break;
    case BC_TAG_INT32:
        {
            int32_t val;
            if (bc_get_sleb128(s, &val))
                return JS_EXCEPTION;
            bc_read_trace(s, "%d\n", val);
            obj = JS_NewInt32(ctx, val);
        }
        break;
    case BC_TAG_FLOAT64:
        {
            JSFloat64Union u;
            if (bc_get_u64(s, &u.u64))
                return JS_EXCEPTION;
            bc_read_trace(s, "%g\n", u.d);
            obj = __JS_NewFloat64(ctx, u.d);
        }
        break;
    case BC_TAG_STRING:
        {
            JSString *p;
            p = JS_ReadString(s);
            if (!p)
                return JS_EXCEPTION;
            obj = JS_MKPTR(JS_TAG_STRING, p);
        }
        break;
    case BC_TAG_FUNCTION_BYTECODE:
        if (!s->allow_bytecode)
            goto invalid_tag;
        obj = JS_ReadFunctionTag(s);
        break;
    case BC_TAG_MODULE:
        if (!s->allow_bytecode)
            goto invalid_tag;
        obj = JS_ReadModule(s);
        break;
    case BC_TAG_OBJECT:
        obj = JS_ReadObjectTag(s);
        break;
    case BC_TAG_ARRAY:
    case BC_TAG_TEMPLATE_OBJECT:
        obj = JS_ReadArray(s, tag);
        break;
    case BC_TAG_TYPED_ARRAY:
        obj = JS_ReadTypedArray(s);
        break;
    case BC_TAG_ARRAY_BUFFER:
        obj = JS_ReadArrayBuffer(s);
        break;
    case BC_TAG_SHARED_ARRAY_BUFFER:
        if (!s->allow_sab || !ctx->rt->sab_funcs.sab_dup)
            goto invalid_tag;
        obj = JS_ReadSharedArrayBuffer(s);
        break;
    case BC_TAG_DATE:
        obj = JS_ReadDate(s);
        break;
    case BC_TAG_OBJECT_VALUE:
        obj = JS_ReadObjectValue(s);
        break;
#ifdef CONFIG_BIGNUM
    case BC_TAG_BIG_INT:
    case BC_TAG_BIG_FLOAT:
    case BC_TAG_BIG_DECIMAL:
        obj = JS_ReadBigNum(s, tag);
        break;
#endif
    case BC_TAG_OBJECT_REFERENCE:
        {
            uint32_t val;
            if (!s->allow_reference)
                return JS_ThrowSyntaxError(ctx, "object references are not allowed");
            if (bc_get_leb128(s, &val))
                return JS_EXCEPTION;
            bc_read_trace(s, "%u\n", val);
            if (val >= s->objects_count) {
                return JS_ThrowSyntaxError(ctx, "invalid object reference (%u >= %u)",
                                           val, s->objects_count);
            }
            obj = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, s->objects[val]));
        }
        break;
    default:
    invalid_tag:
        return JS_ThrowSyntaxError(ctx, "invalid tag (tag=%d pos=%u)",
                                   tag, (unsigned int)(s->ptr - s->buf_start));
    }
    bc_read_trace(s, "}\n");
    return obj;
}